

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::OperatorIntegerDivideFun::GetFunctions(void)

{
  pointer pSVar1;
  LogicalType varargs;
  ScalarFunction *func;
  long lVar2;
  pointer function;
  ScalarFunctionSet *in_RDI;
  pointer other;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffcf4;
  undefined4 in_stack_fffffffffffffcfc;
  FunctionNullHandling in_stack_fffffffffffffd08;
  bind_lambda_function_t in_stack_fffffffffffffd10;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2d8;
  LogicalType local_2c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2a8;
  scalar_function_t local_290;
  LogicalType local_270 [2];
  string local_240;
  LogicalType local_220;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ::std::__cxx11::string::string((string *)&local_240,"//",(allocator *)local_270);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_240);
  ::std::__cxx11::string::~string((string *)&local_240);
  LogicalType::Numeric();
  for (other = local_2d8.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start;
      other != local_2d8.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish; other = other + 1) {
    if (other->id_ != DECIMAL) {
      LogicalType::LogicalType(local_270,other);
      LogicalType::LogicalType(local_270 + 1,other);
      __l._M_len = 2;
      __l._M_array = local_270;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_2a8,__l,(allocator_type *)&stack0xfffffffffffffd17);
      LogicalType::LogicalType(&local_2c0,other);
      GetBinaryFunctionIgnoreZero<duckdb::DivideOperator>(&local_290,other->physical_type_);
      LogicalType::LogicalType(&local_220,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_220;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffcf4;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffcfc;
      ScalarFunction::ScalarFunction
                (&local_208,(vector<duckdb::LogicalType,_true> *)&local_2a8,&local_2c0,&local_290,
                 (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                 (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
                 in_stack_fffffffffffffd08,in_stack_fffffffffffffd10);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_208);
      ScalarFunction::~ScalarFunction(&local_208);
      LogicalType::~LogicalType(&local_220);
      ::std::_Function_base::~_Function_base(&local_290.super__Function_base);
      LogicalType::~LogicalType(&local_2c0);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2a8);
      lVar2 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&local_270[0].id_ + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
    }
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2d8);
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                  ._M_impl.super__Vector_impl_data._M_start; function != pSVar1;
      function = function + 1) {
    BaseScalarFunction::SetReturnsError(&local_e0,&function->super_BaseScalarFunction);
    BaseScalarFunction::~BaseScalarFunction(&local_e0);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet OperatorIntegerDivideFun::GetFunctions() {
	ScalarFunctionSet full_divide("//");
	for (auto &type : LogicalType::Numeric()) {
		if (type.id() == LogicalTypeId::DECIMAL) {
			continue;
		} else {
			full_divide.AddFunction(
			    ScalarFunction({type, type}, type, GetBinaryFunctionIgnoreZero<DivideOperator>(type.InternalType())));
		}
	}
	for (auto &func : full_divide.functions) {
		ScalarFunction::SetReturnsError(func);
	}
	return full_divide;
}